

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O1

int Nf_ManExtractWindow(void *pMan,Vec_Int_t *vRoots,Vec_Wec_t *vCuts,Vec_Wec_t *vObjCuts,
                       Vec_Int_t *vSolCuts,Vec_Int_t *vCutGates,Vec_Wrd_t *vCutAreas,word *pInvArea,
                       int StartVar,int nVars)

{
  undefined8 *puVar1;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  uint uVar5;
  long lVar6;
  Vec_Int_t *pVVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  uint *puVar14;
  ulong uVar15;
  uint uVar16;
  uint *puVar17;
  long lVar18;
  byte bVar19;
  long lVar20;
  Nf_Mat_t *pM [2];
  Vec_Int_t *vObj [2];
  uint local_f8 [4];
  ulong local_e8;
  ulong local_e0;
  Vec_Int_t *local_d8;
  ulong local_d0;
  uint *local_c8;
  long local_c0;
  long local_b8;
  ulong local_b0;
  int local_a4;
  int local_a0;
  uint local_9c;
  Vec_Wec_t *local_98;
  long local_90;
  Vec_Int_t *local_88;
  long *local_80;
  long local_78;
  long local_70;
  long local_68;
  ulong local_60;
  long local_58 [5];
  
  lVar9 = *pMan;
  uVar16 = *(uint *)(*(long *)(lVar9 + 0x40) + 4);
  uVar12 = ~(*(int *)(*(long *)(lVar9 + 0x48) + 4) + uVar16) + *(int *)(lVar9 + 0x18);
  local_d8 = vCutGates;
  if (nVars < (int)(uVar16 + uVar12 * 2)) {
    printf("The number of variables is too large: 2*%d + %d = %d > %d.\n",(ulong)uVar12,
           (ulong)uVar16);
    uVar16 = 0;
  }
  else {
    *pInvArea = *(word *)((long)pMan + 0xd0);
    vRoots->nSize = 0;
    lVar9 = *pMan;
    lVar18 = *(long *)(lVar9 + 0x48);
    if (0 < *(int *)(lVar18 + 4)) {
      lVar20 = 0;
      do {
        iVar13 = *(int *)(*(long *)(lVar18 + 8) + lVar20 * 4);
        if (((long)iVar13 < 0) || (*(int *)(lVar9 + 0x18) <= iVar13)) goto LAB_00782577;
        if (*(long *)(lVar9 + 0x20) == 0) break;
        puVar1 = (undefined8 *)(*(long *)(lVar9 + 0x20) + (long)iVar13 * 0xc);
        uVar12 = (uint)*puVar1;
        if ((~*(uint *)((long)puVar1 + (ulong)(uVar12 & 0x1fffffff) * -0xc) & 0x9fffffff) == 0) {
          __assert_fail("!Gia_ObjIsCi(Gia_ObjFanin0(pObj))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                        ,0x89d,
                        "int Nf_ManExtractWindow(void *, Vec_Int_t *, Vec_Wec_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wrd_t *, word *, int, int)"
                       );
        }
        iVar13 = iVar13 - (uVar12 & 0x1fffffff);
        if (iVar13 < 0) {
LAB_00782460:
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        Vec_IntPush(vRoots,iVar13 * 2 + (uint)((uVar12 >> 0x1d & 1) != 0) + uVar16 * -2 + -2);
        lVar20 = lVar20 + 1;
        lVar9 = *pMan;
        lVar18 = *(long *)(lVar9 + 0x48);
      } while (lVar20 < *(int *)(lVar18 + 4));
    }
    iVar13 = vCuts->nSize;
    if (0 < (long)iVar13) {
      pVVar7 = vCuts->pArray;
      lVar9 = 0;
      do {
        *(undefined4 *)((long)&pVVar7->nSize + lVar9) = 0;
        lVar9 = lVar9 + 0x10;
      } while ((long)iVar13 * 0x10 != lVar9);
    }
    vCuts->nSize = 0;
    iVar13 = vObjCuts->nSize;
    if (0 < (long)iVar13) {
      pVVar7 = vObjCuts->pArray;
      lVar9 = 0;
      do {
        *(undefined4 *)((long)&pVVar7->nSize + lVar9) = 0;
        lVar9 = lVar9 + 0x10;
      } while ((long)iVar13 * 0x10 != lVar9);
    }
    vObjCuts->nSize = 0;
    vSolCuts->nSize = 0;
    local_d8->nSize = 0;
    vCutAreas->nSize = 0;
    lVar9 = *pMan;
    if (0 < *(int *)(lVar9 + 0x18)) {
      local_a4 = uVar16 * 2 + 2;
      uVar12 = uVar16 * 4 ^ 0xfffffffd;
      local_e0 = (ulong)(uVar16 * -2 - 2);
      local_b0 = 0;
      local_c0 = 0;
      local_b8 = 0;
      uVar15 = 0;
      local_98 = vObjCuts;
      local_88 = vSolCuts;
      local_80 = (long *)pMan;
      do {
        uVar8 = *(uint *)(*(long *)(lVar9 + 0x20) + uVar15 * 0xc);
        if ((~uVar8 & 0x1fffffff) != 0 && -1 < (int)uVar8) {
          local_90 = (local_e0 & 0xffffffff) << 4;
          local_f8[0] = 0xffffffff;
          local_f8[1] = 0xffffffff;
          local_58[0] = 0;
          local_58[1] = 0;
          uVar11 = local_b0 & 0xffffffff;
          lVar20 = 0;
          lVar9 = local_c0;
          lVar18 = local_b8;
          local_f8[3] = uVar12;
          local_e8 = uVar15;
          do {
            if (*(int *)((long)pMan + 0x5c) <= (int)uVar11) goto LAB_007824dc;
            if (*(int *)(lVar20 + *(long *)((long)pMan + 0x60) + lVar9) != 0) {
              lVar6 = *(long *)((long)pMan + 0x30);
              uVar12 = *(uint *)(local_b8 + lVar6 + lVar20 * 8);
              uVar8 = *(uint *)(local_b8 + lVar6 + 0x10 + lVar20 * 8);
              if (-1 < (int)(uVar8 ^ uVar12)) {
                __assert_fail("pD->fBest != pA->fBest",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                              ,0x583,"Nf_Mat_t *Nf_ObjMatchBest(Nf_Man_t *, int, int)");
              }
              if ((int)uVar12 < 0) {
                lVar10 = lVar6 + lVar18;
              }
              else {
                lVar10 = 0;
              }
              lVar6 = lVar6 + lVar18 + 0x10;
              if (-1 < (int)uVar8) {
                lVar6 = lVar10;
              }
              if ((*(byte *)(lVar6 + 3) & 0x40) == 0) {
                *(long *)((long)local_58 + lVar20 * 2) = lVar6;
              }
              else {
                if (*(int *)((long)local_f8 + lVar20) != -1) {
                  __assert_fail("iCutInv[c] == -1",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                                ,0x8b4,
                                "int Nf_ManExtractWindow(void *, Vec_Int_t *, Vec_Wec_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wrd_t *, word *, int, int)"
                               );
                }
                *(int *)((long)local_f8 + lVar20) = vSolCuts->nSize;
                Vec_IntPush(vSolCuts,-1);
                lVar9 = local_c0;
              }
            }
            lVar20 = lVar20 + 4;
            lVar18 = lVar18 + 0x20;
            uVar11 = (ulong)((int)uVar11 + 1);
          } while (lVar20 == 4);
          if (vObjCuts->nSize != (int)local_e8 * 2 - local_a4) {
            __assert_fail("Vec_WecSize(vObjCuts) == 2*iObj-LitShift",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                          ,0x8bc,
                          "int Nf_ManExtractWindow(void *, Vec_Int_t *, Vec_Wec_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wrd_t *, word *, int, int)"
                         );
          }
          local_78 = local_e8 * 2;
          lVar9 = 0;
          uVar12 = local_f8[3];
          do {
            pVVar7 = Vec_WecPushLevel(vObjCuts);
            local_58[lVar9 + 2] = (long)pVVar7;
            if ((int)local_e0 + (int)lVar9 < 0) goto LAB_00782460;
            Vec_IntPush(pVVar7,uVar12);
            lVar9 = lVar9 + 1;
            uVar12 = uVar12 + 2;
          } while (lVar9 == 1);
          if ((long)*(int *)((long)pMan + 0x4c) <= (long)local_e8) goto LAB_007824dc;
          uVar12 = *(uint *)(*(long *)((long)pMan + 0x50) + local_e8 * 4);
          uVar8 = (int)uVar12 >> 0x10;
          if (((int)uVar8 < 0) || (*(int *)((long)pMan + 0x3c) <= (int)uVar8)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          lVar9 = *(long *)(*(long *)((long)pMan + 0x40) + (ulong)uVar8 * 8);
          uVar15 = (ulong)(uVar12 & 0xffff);
          if (0 < *(int *)(lVar9 + uVar15 * 4)) {
            local_c8 = (uint *)(lVar9 + uVar15 * 4);
            puVar17 = local_c8 + 1;
            iVar13 = 0;
            do {
              uVar12 = *puVar17;
              local_d0 = (ulong)uVar12;
              uVar8 = uVar12 & 0x1f;
              if ((uVar8 == 1) && (local_e8 == puVar17[1])) {
                __assert_fail("!Nf_CutIsTriv(pCut, iObj)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                              ,0x8c6,
                              "int Nf_ManExtractWindow(void *, Vec_Int_t *, Vec_Wec_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wrd_t *, word *, int, int)"
                             );
              }
              local_a0 = iVar13;
              if (**(int **)((long)pMan + 8) < (int)uVar8) {
                __assert_fail("Nf_CutSize(pCut) <= p->pPars->nLutSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                              ,0x8c7,
                              "int Nf_ManExtractWindow(void *, Vec_Int_t *, Vec_Wec_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wrd_t *, word *, int, int)"
                             );
              }
              if ((int)(uVar12 >> 6) < *(int *)(*(long *)((long)pMan + 0x18) + 4)) {
                lVar9 = *(long *)(*(long *)((long)pMan + 0x18) + 8);
                uVar15 = (ulong)((uVar12 >> 6) << 4);
                if (1 < *(int *)(lVar9 + 4 + uVar15)) {
                  local_d0 = (ulong)(uVar12 >> 5);
                  local_70 = lVar9 + uVar15;
                  local_60 = (ulong)((long)puVar17 - (long)local_c8) >> 2;
                  lVar9 = 0;
                  do {
                    uVar12 = *(uint *)(*(long *)(local_70 + 8) + lVar9 * 4);
                    lVar18 = *(long *)((long)pMan + 0x20);
                    if (uVar8 != *(uint *)(lVar18 + 0x10 + (long)(int)uVar12 * 0x50) >> 0x1c) {
                      __assert_fail("nFans == (int)pC->nFanins",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                                    ,0x8d5,
                                    "int Nf_ManExtractWindow(void *, Vec_Int_t *, Vec_Wec_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wrd_t *, word *, int, int)"
                                   );
                    }
                    uVar2 = *(uint *)(*(long *)(local_70 + 8) + 4 + lVar9 * 4);
                    local_9c = (uVar2 ^ (uint)local_d0) & 1;
                    local_68 = lVar9;
                    Vec_IntPush(local_d8,uVar12);
                    Vec_WrdPush(vCutAreas,*(word *)(lVar18 + (long)(int)uVar12 * 0x50 + 0x18));
                    lVar9 = 0;
                    puVar14 = local_c8;
                    do {
                      puVar4 = (uint *)local_58[lVar9];
                      if (puVar4 != (uint *)0x0) {
                        if (puVar17 <= puVar14) {
                          __assert_fail("pCut > pCutSet",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                                        ,0x93,"int Nf_CutHandle(int *, int *)");
                        }
                        if ((((*puVar4 & 0xfffff) == uVar12) &&
                            ((*puVar4 >> 0x14 & 0x3ff) == (uint)local_60)) &&
                           (puVar4[1] == (uVar2 & 0xfffffffe))) {
                          Vec_IntPush(local_88,vCuts->nSize);
                          puVar14 = local_c8;
                        }
                      }
                      lVar9 = lVar9 + 1;
                    } while (lVar9 == 1);
                    iVar13 = vCuts->nSize + StartVar;
                    if (iVar13 < 0) goto LAB_00782460;
                    pVVar7 = Vec_WecPushLevel(vCuts);
                    uVar12 = local_9c;
                    Vec_IntPush(pVVar7,local_9c | (uint)local_78);
                    Vec_IntPush((Vec_Int_t *)local_58[(ulong)uVar12 + 2],iVar13 * 2);
                    if (uVar8 != 0) {
                      bVar19 = 0;
                      uVar12 = 0;
                      do {
                        uVar5 = (uint)(((uVar2 >> 1 & 0x7f) >> (uVar12 & 0x1f) & 1) != 0);
                        uVar3 = puVar17[(ulong)((uVar2 >> 8) >> (bVar19 & 0x1f) & 0xf) + 1];
                        if ((int)uVar16 < (int)uVar3) {
LAB_007821a4:
                          if ((int)uVar3 < 0) goto LAB_00782460;
                          Vec_IntPush(pVVar7,uVar5 + uVar3 * 2);
                        }
                        else if (uVar5 != 0) {
                          uVar5 = 1;
                          goto LAB_007821a4;
                        }
                        uVar12 = uVar12 + 1;
                        bVar19 = bVar19 + 4;
                      } while (uVar8 != uVar12);
                    }
                    lVar9 = local_68 + 2;
                    pMan = local_80;
                  } while ((int)((uint)lVar9 | 1) < *(int *)(local_70 + 4));
                }
              }
              iVar13 = local_a0 + 1;
              puVar17 = puVar17 + (ulong)(*puVar17 & 0x1f) + 1;
            } while (iVar13 < (int)*local_c8);
          }
          vSolCuts = local_88;
          if ((local_f8[0] != 0xffffffff) && (local_f8[1] != -1)) {
            __assert_fail("iCutInv[0] == -1 || iCutInv[1] == -1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                          ,0x8f6,
                          "int Nf_ManExtractWindow(void *, Vec_Int_t *, Vec_Wec_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wrd_t *, word *, int, int)"
                         );
          }
          lVar9 = 0;
          do {
            lVar18 = local_90;
            uVar12 = local_f8[lVar9];
            if ((ulong)uVar12 != 0xffffffff) {
              if (((int)uVar12 < 0) || (vSolCuts->nSize <= (int)uVar12)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
              }
              vSolCuts->pArray[uVar12] = vCuts->nSize;
            }
            iVar13 = (int)local_e0 + (int)lVar9;
            if ((iVar13 < 0) || (local_98->nSize <= iVar13)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                            ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
            }
            iVar13 = vCuts->nSize + StartVar;
            if (iVar13 < 0) goto LAB_00782460;
            Vec_IntPush((Vec_Int_t *)((long)&local_98->pArray->nCap + local_90),iVar13 * 2);
            pVVar7 = Vec_WecPushLevel(vCuts);
            uVar12 = (int)local_b0 + (int)lVar9;
            Vec_IntPush(pVVar7,uVar12);
            Vec_IntPush(pVVar7,uVar12 ^ 1);
            Vec_IntPush(local_d8,3);
            Vec_WrdPush(vCutAreas,*(word *)((long)pMan + 0xd0));
            lVar9 = lVar9 + 1;
            local_90 = lVar18 + 0x10;
            uVar15 = local_e8;
            vObjCuts = local_98;
            uVar12 = local_f8[3];
          } while (lVar9 == 1);
        }
        uVar15 = uVar15 + 1;
        lVar9 = *pMan;
        local_b8 = local_b8 + 0x40;
        local_c0 = local_c0 + 8;
        local_b0 = local_b0 + 2;
        uVar12 = uVar12 + 4;
        local_e0 = local_e0 + 2;
      } while ((long)uVar15 < (long)*(int *)(lVar9 + 0x18));
    }
    lVar9 = *pMan;
    lVar18 = *(long *)(lVar9 + 0x40);
    uVar12 = *(uint *)(lVar18 + 4);
    uVar15 = (ulong)uVar12;
    if (0 < (int)uVar12) {
      iVar13 = 2;
      lVar20 = 0;
      do {
        uVar12 = (uint)uVar15;
        uVar8 = *(uint *)(*(long *)(lVar18 + 8) + lVar20 * 4);
        if (((int)uVar8 < 0) || (*(int *)(lVar9 + 0x18) <= (int)uVar8)) {
LAB_00782577:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if ((ulong)uVar8 == 0) break;
        lVar18 = (ulong)uVar8 * 2 + 1;
        if (*(int *)((long)pMan + 0x5c) <= (int)lVar18) {
LAB_007824dc:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if (*(int *)(*(long *)((long)pMan + 0x60) + lVar18 * 4) != 0) {
          Vec_IntPush(vSolCuts,(uVar12 + *(int *)(*(long *)(lVar9 + 0x48) + 4)) * 2 +
                               *(int *)(lVar9 + 0x18) * -2 + iVar13);
        }
        lVar20 = lVar20 + 1;
        lVar9 = *pMan;
        lVar18 = *(long *)(lVar9 + 0x40);
        uVar12 = *(uint *)(lVar18 + 4);
        uVar15 = (ulong)(int)uVar12;
        iVar13 = iVar13 + -1;
      } while (lVar20 < (long)uVar15);
    }
    if (vCuts->nSize != local_d8->nSize) {
      __assert_fail("Vec_WecSize(vCuts) == Vec_IntSize(vCutGates)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                    ,0x90d,
                    "int Nf_ManExtractWindow(void *, Vec_Int_t *, Vec_Wec_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wrd_t *, word *, int, int)"
                   );
    }
    if (vCuts->nSize != vCutAreas->nSize) {
      __assert_fail("Vec_WecSize(vCuts) == Vec_WrdSize(vCutAreas)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                    ,0x90e,
                    "int Nf_ManExtractWindow(void *, Vec_Int_t *, Vec_Wec_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wrd_t *, word *, int, int)"
                   );
    }
    if (vObjCuts->nSize !=
        (~(uVar12 + *(int *)(*(long *)(lVar9 + 0x48) + 4)) + *(int *)(lVar9 + 0x18)) * 2) {
      __assert_fail("Vec_WecSize(vObjCuts) == 2*Gia_ManAndNum(p->pGia)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                    ,0x90f,
                    "int Nf_ManExtractWindow(void *, Vec_Int_t *, Vec_Wec_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wrd_t *, word *, int, int)"
                   );
    }
  }
  return uVar16;
}

Assistant:

int Nf_ManExtractWindow( void * pMan, Vec_Int_t * vRoots, Vec_Wec_t * vCuts, Vec_Wec_t * vObjCuts, Vec_Int_t * vSolCuts, Vec_Int_t * vCutGates, Vec_Wrd_t * vCutAreas, word * pInvArea, int StartVar, int nVars )
{
    Nf_Man_t * p = (Nf_Man_t *)pMan;
    int nInputs = Gia_ManCiNum(p->pGia);
    int LitShift = 2*nInputs+2;
    Gia_Obj_t * pObj;
    int c, iObj;
    if ( 2*Gia_ManAndNum(p->pGia) + Gia_ManCiNum(p->pGia) > nVars )
    {
        printf( "The number of variables is too large: 2*%d + %d = %d > %d.\n", Gia_ManAndNum(p->pGia), Gia_ManCiNum(p->pGia), 2*Gia_ManAndNum(p->pGia) + Gia_ManCiNum(p->pGia), nVars );
        return 0;
    }
    *pInvArea = p->InvAreaW;
    // save roots
    Vec_IntClear( vRoots );
    Gia_ManForEachCo( p->pGia, pObj, c )
    {
        assert( !Gia_ObjIsCi(Gia_ObjFanin0(pObj)) );
        Vec_IntPush( vRoots, Gia_ObjFaninLit0p(p->pGia, pObj)-LitShift );
    }
    // prepare
    Vec_WecClear( vCuts );
    Vec_WecClear( vObjCuts );
    Vec_IntClear( vSolCuts );
    Vec_IntClear( vCutGates );
    Vec_WrdClear( vCutAreas );
    // collect cuts for each node
    Gia_ManForEachAndId( p->pGia, iObj )
    {
        Vec_Int_t * vObj[2], * vCutOne;
        int iCut, * pCut, * pCutSet;
        int iCutInv[2] = {-1, -1};
        // get matches
        Nf_Mat_t * pM[2] = {NULL, NULL};
        for ( c = 0; c < 2; c++ )
        {
            if ( Nf_ObjMapRefNum(p, iObj, c) == 0 )
                continue;
            if ( Nf_ObjMatchBest(p, iObj, c)->fCompl )
            {
                assert( iCutInv[c] == -1 );
                iCutInv[c] = Vec_IntSize(vSolCuts);
                Vec_IntPush( vSolCuts, -1 );
                continue;
            }
            pM[c] = Nf_ObjMatchBest(p, iObj, c);
        }
        // start collecting cuts of pos-obj and neg-obj
        assert( Vec_WecSize(vObjCuts) == 2*iObj-LitShift );
        for ( c = 0; c < 2; c++ )
        {
            vObj[c] = Vec_WecPushLevel( vObjCuts );
            Vec_IntPush( vObj[c], Abc_Var2Lit(Abc_Var2Lit(iObj, c)-LitShift, 1) );
        }
        // enumerate cuts
        pCutSet = Nf_ObjCutSet( p, iObj );
        Nf_SetForEachCut( pCutSet, pCut, iCut )
        {
            assert( !Nf_CutIsTriv(pCut, iObj) );
            assert( Nf_CutSize(pCut) <= p->pPars->nLutSize );
            if ( Abc_Lit2Var(Nf_CutFunc(pCut)) < Vec_WecSize(p->vTt2Match) )
            {
                int * pFans      = Nf_CutLeaves(pCut);
                int nFans        = Nf_CutSize(pCut);
                int iFuncLit     = Nf_CutFunc(pCut);
                int fComplExt    = Abc_LitIsCompl(iFuncLit);
                Vec_Int_t * vArr = Vec_WecEntry( p->vTt2Match, Abc_Lit2Var(iFuncLit) );
                int i, k, c, Info, Offset, iFanin, fComplF, iCutLit;
                Vec_IntForEachEntryDouble( vArr, Info, Offset, i )
                {
                    Nf_Cfg_t Cfg   = Nf_Int2Cfg(Offset);
                    int fCompl     = Cfg.fCompl ^ fComplExt;
                    Mio_Cell2_t*pC = Nf_ManCell( p, Info );
                    assert( nFans == (int)pC->nFanins );
                    Vec_IntPush( vCutGates, Info );
                    Vec_WrdPush( vCutAreas, pC->AreaW );
                    // to make comparison possible
                    Cfg.fCompl = 0;
                    // add solution cut
                    for ( c = 0; c < 2; c++ )
                    {
                        if ( pM[c] == NULL )
                            continue;
                        if ( (int)pM[c]->CutH == Nf_CutHandle(pCutSet, pCut) && (int)pM[c]->Gate == Info && Nf_Cfg2Int(pM[c]->Cfg) == Nf_Cfg2Int(Cfg) )
                        {
                            Vec_IntPush( vSolCuts, Vec_WecSize(vCuts) );
                            //printf( "adding solution for %d\n", Abc_Var2Lit(iObj, c)-LitShift );
                        }
                    }
                    // add new cut
                    iCutLit = Abc_Var2Lit( StartVar + Vec_WecSize(vCuts), 0 );
                    vCutOne = Vec_WecPushLevel( vCuts );
                    // add literals
                    Vec_IntPush( vCutOne, Abc_Var2Lit(iObj, fCompl) );
                    Vec_IntPush( vObj[fCompl], iCutLit );
                    Nf_CfgForEachVarCompl( Cfg, nFans, iFanin, fComplF, k )
                        if ( pFans[iFanin] >= nInputs + 1 ) // internal node
                        {
                            Vec_IntPush( vCutOne, Abc_Var2Lit(pFans[iFanin], fComplF) );
                            //Vec_IntPush( Vec_WecEntry(vObjCuts, Abc_Var2Lit(pFans[iFanin], fComplF)-LitShift), iCutLit );
                        }
                        else if ( fComplF ) // complemented primary input
                            Vec_IntPush( vCutOne, Abc_Var2Lit(pFans[iFanin], 1) );
                } 
            }
        }
        assert( iCutInv[0] == -1 || iCutInv[1] == -1 );
        // add inverter cut
        for ( c = 0; c < 2; c++ )
        {
            if ( iCutInv[c] != -1 )
                Vec_IntWriteEntry( vSolCuts, iCutInv[c], Vec_WecSize(vCuts) );
            // the obj-lit implies its cut
            Vec_IntPush( Vec_WecEntry(vObjCuts, Abc_Var2Lit(iObj, c)-LitShift), Abc_Var2Lit(StartVar + Vec_WecSize(vCuts), 0) );
            // the cut includes both literals
            vCutOne = Vec_WecPushLevel( vCuts );
            Vec_IntPush( vCutOne, Abc_Var2Lit(iObj, c) );
            Vec_IntPush( vCutOne, Abc_Var2Lit(iObj, !c) );
            Vec_IntPush( vCutGates, 3 );
            Vec_WrdPush( vCutAreas, p->InvAreaW );
        }
    }
//    for ( c = 0; c < p->nCells; c++ )
//        printf( "%d=%s ", c, p->pCells[c].pName );
//    printf( "\n" );
    // add complemented inputs
    Gia_ManForEachCiId( p->pGia, iObj, c )
        if ( Nf_ObjMapRefNum(p, iObj, 1) )
            Vec_IntPush( vSolCuts, -(2*Gia_ManAndNum(p->pGia)+c) );
    assert( Vec_WecSize(vCuts) == Vec_IntSize(vCutGates) );
    assert( Vec_WecSize(vCuts) == Vec_WrdSize(vCutAreas) );
    assert( Vec_WecSize(vObjCuts) == 2*Gia_ManAndNum(p->pGia) );
    return nInputs;
}